

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

int Gia_ManDupDemiterFindMin(Vec_Wec_t *vSupps,Vec_Int_t *vTakenIns,Vec_Int_t *vTakenOuts)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int iVar3;
  int i;
  int i_00;
  int local_40;
  
  local_40 = 1000000000;
  iVar3 = -1;
  for (i_00 = 0; i_00 < vSupps->nSize; i_00 = i_00 + 1) {
    p = Vec_WecEntry(vSupps,i_00);
    iVar1 = Vec_IntEntry(vTakenOuts,i_00);
    if (iVar1 == 0) {
      iVar1 = 0;
      for (i = 0; i < p->nSize; i = i + 1) {
        iVar2 = Vec_IntEntry(p,i);
        iVar2 = Vec_IntEntry(vTakenIns,iVar2);
        iVar1 = iVar1 + (uint)(iVar2 == 0);
      }
      if (iVar1 < local_40) {
        iVar3 = i_00;
      }
      if (iVar1 <= local_40) {
        local_40 = iVar1;
      }
    }
  }
  return iVar3;
}

Assistant:

int Gia_ManDupDemiterFindMin( Vec_Wec_t * vSupps, Vec_Int_t * vTakenIns, Vec_Int_t * vTakenOuts )
{
    Vec_Int_t * vLevel;
    int i, k, iObj, iObjBest = -1;
    int Count, CountBest = ABC_INFINITY;
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        if ( Vec_IntEntry(vTakenOuts, i) )
            continue;
        Count = 0;
        Vec_IntForEachEntry( vLevel, iObj, k )
            Count += !Vec_IntEntry(vTakenIns, iObj);
        if ( CountBest > Count )
        {
            CountBest = Count;
            iObjBest = i;
        }
    }
    return iObjBest;
}